

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::V_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<(anonymous_namespace)::V_const&> *this,
          int *rhs)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  result *extraout_RAX;
  result *extraout_RAX_00;
  result *prVar4;
  int *value;
  ostringstream os;
  long *local_220;
  long local_218;
  long local_210 [2];
  result *local_200;
  long local_1f8;
  undefined1 local_1f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  iVar2 = *(int *)(this + 4);
  iVar1 = *rhs;
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"==","");
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  to_string<(anonymous_namespace)::V>(&local_1c0,(V *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_220,local_218);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  string_maker<int>::to_string_abi_cxx11_
            ((string *)(local_1f0 + 0x10),(string_maker<int> *)rhs,value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(char *)local_1f0._16_8_,local_1d8._M_allocated_capacity);
  if ((char *)local_1f0._16_8_ != local_1d8._M_local_buf + 8) {
    operator_delete((void *)local_1f0._16_8_,local_1d8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  __return_storage_ptr__->passed = iVar2 == iVar1;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_200,
             &local_200->passed + local_1f8);
  prVar4 = (result *)local_1f0;
  if (local_200 != prVar4) {
    operator_delete(local_200,local_1f0._0_8_ + 1);
    prVar4 = extraout_RAX;
  }
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
    prVar4 = extraout_RAX_00;
  }
  return prVar4;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }